

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

bool __thiscall ritobin::io::impl_binary_read::BinBinaryReader::read_entries(BinBinaryReader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint *pos;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  byte unaff_BPL;
  pointer puVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> entryNameHashes;
  byte local_20b;
  FNV1a local_208;
  BinBinaryReader *local_1e0;
  Embed local_1d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_198;
  pointer local_180;
  pointer local_178;
  undefined1 local_170 [64];
  __index_type local_130;
  undefined2 local_128 [4];
  vector<ritobin::Pair,_std::allocator<ritobin::Pair>_> local_120;
  undefined1 local_108 [64];
  __index_type local_c8;
  Pair local_c0;
  
  local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pos = (uint *)(this->reader).cur_;
  if ((this->reader).cap_ < pos + 1) {
    local_20b = fail_msg(this,"reader.read(entryCount)",(char *)pos);
  }
  else {
    uVar2 = *pos;
    (this->reader).cur_ = (char *)(pos + 1);
    pcVar3 = (this->reader).cur_;
    bVar4 = BinaryReader::read<unsigned_int>(&this->reader,&local_198,(ulong)uVar2);
    if (bVar4) {
      local_128[0] = 0x8311;
      local_120.super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_120.super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_120.super__Vector_base<ritobin::Pair,_std::allocator<ritobin::Pair>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_180 = local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      bVar4 = local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish;
      local_20b = unaff_BPL;
      local_1e0 = this;
      if (!bVar4) {
        paVar1 = &local_1d8.name.str_.field_2;
        puVar6 = local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          paVar7 = &local_208.str_.field_2;
          local_1d8.name.hash_ = *puVar6;
          local_208.hash_ = 0;
          local_208._4_4_ = 0;
          local_208.str_.field_2._8_8_ = 0;
          local_208.str_._M_string_length = 0;
          local_208.str_.field_2._M_allocated_capacity = 0;
          local_1d8.name.str_._M_string_length = 0;
          local_1d8.name.str_.field_2._M_local_buf[0] = '\0';
          local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          pcVar3 = (local_1e0->reader).cur_;
          local_208.str_._M_dataplus._M_p = (pointer)paVar7;
          local_1d8.name.str_._M_dataplus._M_p = (pointer)paVar1;
          bVar5 = read_entry(local_1e0,(Hash *)&local_208,&local_1d8);
          if (!bVar5) {
            local_20b = fail_msg(local_1e0,"read_entry(entryKeyHash, entry)",pcVar3);
          }
          if (!bVar5) {
            std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::~vector(&local_1d8.items);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8.name.str_._M_dataplus._M_p != paVar1) {
              operator_delete(local_1d8.name.str_._M_dataplus._M_p,
                              CONCAT71(local_1d8.name.str_.field_2._M_allocated_capacity._1_7_,
                                       local_1d8.name.str_.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_208.str_._M_dataplus._M_p != paVar7) {
              operator_delete(local_208.str_._M_dataplus._M_p,
                              local_208.str_.field_2._M_allocated_capacity + 1);
            }
            break;
          }
          local_108._0_4_ = local_208.hash_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208.str_._M_dataplus._M_p == paVar7) {
            local_108._32_8_ = local_208.str_.field_2._8_8_;
            local_108._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_108 + 0x18);
          }
          else {
            local_108._8_8_ = local_208.str_._M_dataplus._M_p;
          }
          local_108._24_8_ = local_208.str_.field_2._M_allocated_capacity;
          local_108._16_8_ = local_208.str_._M_string_length;
          local_208.str_._M_string_length = 0;
          local_208.str_.field_2._M_allocated_capacity =
               local_208.str_.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_c8 = '\x11';
          local_170._0_4_ = local_1d8.name.hash_;
          local_170._8_8_ = local_170 + 0x18;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8.name.str_._M_dataplus._M_p == paVar1) {
            local_170._32_8_ = local_1d8.name.str_.field_2._8_8_;
          }
          else {
            local_170._8_8_ = local_1d8.name.str_._M_dataplus._M_p;
          }
          local_170._25_7_ = local_1d8.name.str_.field_2._M_allocated_capacity._1_7_;
          local_170[0x18] = local_1d8.name.str_.field_2._M_local_buf[0];
          local_170._16_8_ = local_1d8.name.str_._M_string_length;
          local_1d8.name.str_._M_string_length = 0;
          local_1d8.name.str_.field_2._M_local_buf[0] = '\0';
          local_170._40_8_ =
               local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
               _M_impl.super__Vector_impl_data._M_start;
          local_170._48_8_ =
               local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_170._56_8_ =
               local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_1d8.items.super__Vector_base<ritobin::Field,_std::allocator<ritobin::Field>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_130 = '\x16';
          local_208.str_._M_dataplus._M_p = (pointer)paVar7;
          local_1d8.name.str_._M_dataplus._M_p = (pointer)paVar1;
          local_178 = puVar6;
          std::__detail::__variant::
          _Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::_Move_ctor_base((_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                             *)&local_c0,
                            (_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                             *)local_108);
          std::__detail::__variant::
          _Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::_Move_ctor_base((_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                             *)&local_c0.value,
                            (_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                             *)local_170);
          std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::emplace_back<ritobin::Pair>
                    (&local_120,&local_c0);
          std::__detail::__variant::
          _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                               *)&local_c0.value);
          std::__detail::__variant::
          _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                               *)&local_c0);
          std::__detail::__variant::
          _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                               *)local_170);
          std::__detail::__variant::
          _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
          ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                               *)local_108);
          std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::~vector(&local_1d8.items);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8.name.str_._M_dataplus._M_p != paVar1) {
            operator_delete(local_1d8.name.str_._M_dataplus._M_p,
                            CONCAT71(local_1d8.name.str_.field_2._M_allocated_capacity._1_7_,
                                     local_1d8.name.str_.field_2._M_local_buf[0]) + 1);
          }
          puVar6 = local_178;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208.str_._M_dataplus._M_p != &local_208.str_.field_2) {
            operator_delete(local_208.str_._M_dataplus._M_p,
                            local_208.str_.field_2._M_allocated_capacity + 1);
          }
          if (!bVar5) break;
          puVar6 = puVar6 + 1;
          bVar4 = puVar6 == local_180;
        } while (!bVar4);
      }
      if (bVar4) {
        local_20b = 1;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<char_const(&)[8],ritobin::Map>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<ritobin::None,ritobin::Bool,ritobin::I8,ritobin::U8,ritobin::I16,ritobin::U16,ritobin::I32,ritobin::U32,ritobin::I64,ritobin::U64,ritobin::F32,ritobin::Vec2,ritobin::Vec3,ritobin::Vec4,ritobin::Mtx44,ritobin::RGBA,ritobin::String,ritobin::Hash,ritobin::File,ritobin::List,ritobin::List2,ritobin::Pointer,ritobin::Embed,ritobin::Link,ritobin::Option,ritobin::Map,ritobin::Flag>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_1e0->bin,"entries",local_128);
      }
      std::vector<ritobin::Pair,_std::allocator<ritobin::Pair>_>::~vector(&local_120);
    }
    else {
      local_20b = fail_msg(this,"reader.read(entryNameHashes, entryCount)",pcVar3);
    }
  }
  if (local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)(local_20b & 1);
}

Assistant:

bool read_entries() noexcept {
            uint32_t entryCount = 0;
            std::vector<uint32_t> entryNameHashes;
            bin_assert(reader.read(entryCount));
            bin_assert(reader.read(entryNameHashes, entryCount));
            Map entriesMap = { Type::HASH,  Type::EMBED, {} };
            for (uint32_t entryNameHash : entryNameHashes) {
                Hash entryKeyHash = {};
                Embed entry = { { entryNameHash }, {} };
                bin_assert(read_entry(entryKeyHash, entry));
                entriesMap.items.emplace_back(Pair{ std::move(entryKeyHash), std::move(entry) });
            }
            bin.sections.emplace("entries", std::move(entriesMap));
            return true;
        }